

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

void sznet::net::sockets::sz_setnonblockandcloseonexec(sz_sock sockfd)

{
  uint uVar1;
  undefined4 in_register_0000003c;
  
  uVar1 = fcntl64(CONCAT44(in_register_0000003c,sockfd),3,0);
  fcntl64(sockfd,4,uVar1 | 0x800);
  uVar1 = fcntl64(sockfd,1,0);
  fcntl64(sockfd,2,uVar1 | 1);
  return;
}

Assistant:

void sz_setnonblockandcloseonexec(sznet::net::sockets::sz_sock sockfd)
{
#if defined(SZ_OS_LINUX)
	// non-block
	int flags = ::fcntl(sockfd, F_GETFL, 0);
	flags |= O_NONBLOCK;
	int ret = ::fcntl(sockfd, F_SETFL, flags);

	// close-on-exec
	flags = ::fcntl(sockfd, F_GETFD, 0);
	flags |= FD_CLOEXEC;
	ret = ::fcntl(sockfd, F_SETFD, flags);
	(void)ret;
#else
	u_long flag = 1;
	ioctlsocket(sockfd, FIONBIO, &flag);
#endif
}